

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContextTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::SpanContext_testBaggage_Test::~SpanContext_testBaggage_Test
          (SpanContext_testBaggage_Test *this)

{
  SpanContext_testBaggage_Test *this_local;
  
  ~SpanContext_testBaggage_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(SpanContext, testBaggage)
{
    const SpanContext spanContext(
        TraceID(0, 0),
        0,
        0,
        0,
        SpanContext::StrMap({ { "key1", "value1" }, { "key2", "value2" } }));
    std::string keyCopy;
    std::string valueCopy;
    spanContext.ForeachBaggageItem(
        [&keyCopy, &valueCopy](const std::string& key,
                               const std::string& value) {
            keyCopy = key;
            valueCopy = value;
            return false;
        });
    ASSERT_TRUE(keyCopy == "key1" || keyCopy == "key2");
    if (keyCopy == "key1") {
        ASSERT_EQ("value1", valueCopy);
    }
    else {
        ASSERT_EQ("value2", valueCopy);
    }
}